

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O3

int test_kvtree_util_set_get_unsigned_long(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  kvtree *kvtree;
  unsigned_long roundtrip;
  long local_40;
  long local_38;
  
  local_38 = 0;
  lVar3 = kvtree_new();
  local_40 = lVar3;
  iVar1 = kvtree_util_set_unsigned_long(lVar3,"KEY",0x11);
  iVar2 = kvtree_util_get_unsigned_long(lVar3,"KEY",&local_38);
  bVar4 = local_38 != 0x11;
  kvtree_delete(&local_40);
  return (uint)((iVar2 != 0 || (iVar1 != 0 || lVar3 == 0)) || bVar4);
}

Assistant:

int test_kvtree_util_set_get_unsigned_long(){
  int rc = TEST_PASS;
  char* key = "KEY";
  unsigned long value = 17;
  unsigned long roundtrip = 0;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_unsigned_long(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_unsigned_long(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}